

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::Binder::PlanSubquery
          (Binder *this,BoundSubqueryExpression *expr,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  LogicalType *other;
  vector<duckdb::LogicalType,_true> *pvVar1;
  char cVar2;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var4;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  ulong uVar7;
  __node_base _Var8;
  ColumnBinding binding;
  ColumnBinding binding_00;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *puVar9;
  undefined8 uVar10;
  undefined1 auVar11 [8];
  element_type *peVar12;
  _Head_base<0UL,_duckdb::LogicalAggregate_*,_false> _Var13;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var14;
  bool bVar15;
  Binder *pBVar16;
  type pLVar17;
  pointer pLVar18;
  type pLVar19;
  pointer pLVar20;
  reference pvVar21;
  unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>_> this_01;
  pointer this_02;
  unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
  uVar22;
  _Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
  _Var23;
  reference pvVar24;
  reference pvVar25;
  LogicalLimit *pLVar26;
  ClientConfig *pCVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *aggregate_index;
  pointer pEVar28;
  element_type *peVar29;
  pointer pBVar30;
  pointer pBVar31;
  ClientContext *pCVar32;
  pointer pBVar33;
  idx_t iVar34;
  idx_t group_index;
  LogicalAggregate *pLVar35;
  pointer pLVar36;
  BoundColumnRefExpression *pBVar37;
  BoundComparisonExpression *this_03;
  pointer table_index;
  unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> this_04;
  pointer pLVar38;
  NotImplementedException *this_05;
  element_type *in_RCX;
  long lVar39;
  _Head_base<0UL,_duckdb::LogicalLimit_*,_false> _Var40;
  undefined8 uVar41;
  undefined8 *puVar42;
  undefined8 *puVar43;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> _Var44;
  pointer *__ptr;
  vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns;
  size_type sVar45;
  pointer *__ptr_1;
  byte bVar46;
  ColumnBinding binding_01;
  ColumnBinding binding_02;
  ColumnBinding binding_03;
  ColumnBinding binding_04;
  templated_unique_single_t first_ref;
  unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
  delim_join_1;
  templated_unique_single_t limit;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  dependent_join;
  templated_unique_single_t aggregate;
  unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
  delim_join;
  templated_unique_single_t count_check;
  templated_unique_single_t aggr;
  templated_unique_single_t projection;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  dependent_join_1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projection_list;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
  count_star;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  subquery_root;
  templated_unique_single_t proj;
  templated_unique_single_t case_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> error_expr;
  FunctionBinder function_binder_1;
  vector<duckdb::ColumnBinding,_true> plan_columns;
  shared_ptr<duckdb::Binder,_true> sub_binder;
  FlattenDependentJoins flatten;
  vector<duckdb::ColumnBinding,_true> plan_columns_3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_5b8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_5b0
  ;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_5a8;
  Binder *local_5a0;
  LogicalType local_598;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_580;
  undefined1 local_578 [8];
  _Hash_node_base *p_Stack_570;
  _Alloc_hider local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  optional_idx local_548;
  element_type *local_538;
  undefined1 local_530 [8];
  undefined1 local_528 [24];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_510;
  _Head_base<0UL,_duckdb::LogicalAggregate_*,_false> local_508;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_500;
  undefined1 local_4f8 [40];
  _Alloc_hider local_4d0;
  undefined1 local_4c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [3];
  _Head_base<0UL,_duckdb::LogicalLimit_*,_false> local_480;
  FunctionBinder local_478;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_468;
  _Head_base<0UL,_duckdb::LogicalLimit_*,_false> local_458;
  __node_base _Stack_450;
  aggregate_size_t local_448;
  ColumnBinding local_438;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_428;
  undefined1 local_420 [16];
  Binder *local_410;
  FunctionBinder local_408;
  undefined1 local_3f8 [32];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [288];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [80];
  undefined1 local_238 [56];
  undefined1 local_200 [24];
  undefined8 auStack_1e8 [5];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1c0 [3];
  undefined8 local_178;
  undefined8 local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [160];
  undefined8 auStack_b8 [17];
  
  bVar46 = 0;
  local_5b0 = root;
  local_5a0 = (Binder *)expr;
  local_538 = in_RCX;
  CreateBinder((Binder *)local_2a8,
               (ClientContext *)(expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p
               ,(optional_ptr<duckdb::Binder,_true>)expr,REGULAR_BINDER);
  pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2a8);
  pBVar16->is_outside_flattened = false;
  pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2a8);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(local_5b0 + 0xd));
  CreatePlan((Binder *)local_420,(BoundQueryNode *)pBVar16);
  uVar41 = local_420._0_8_;
  local_420._0_8_ = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this_00 = (shared_ptr<duckdb::Binder,_true> *)(local_5b0 + 0xb);
  pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  if ((pBVar16->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pBVar16->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_5b8._M_head_impl = (LogicalOperator *)uVar41;
    cVar2 = *(char *)&local_5b0[0xe].
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    if (cVar2 == '\x01') {
      pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_5b8);
      (*pLVar18->_vptr_LogicalOperator[2])(local_528);
      pvVar21 = vector<duckdb::ColumnBinding,_true>::operator[]
                          ((vector<duckdb::ColumnBinding,_true> *)local_528,0);
      uVar7 = pvVar21->table_index;
      pCVar27 = ClientConfig::GetConfig
                          ((ClientContext *)(((string *)&local_5a0->context)->_M_dataplus)._M_p);
      bVar15 = pCVar27->scalar_subquery_error_on_multiple_rows;
      local_598._0_8_ = (ClientContext *)0x0;
      local_598.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_598.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pCVar32 = (ClientContext *)operator_new(0x70);
      other = (LogicalType *)(local_5b0 + 7);
      LogicalType::LogicalType((LogicalType *)local_298,other);
      binding_01.column_index = 0;
      binding_01.table_index = uVar7;
      BoundColumnRefExpression::BoundColumnRefExpression
                ((BoundColumnRefExpression *)pCVar32,(LogicalType *)local_298,binding_01,0);
      LogicalType::~LogicalType((LogicalType *)local_298);
      local_558._M_allocated_capacity = 0;
      local_558._8_8_ = 0;
      local_548.index = 0;
      local_298._0_8_ = pCVar32;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_558._M_local_buf,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_298);
      if ((ClientContext *)local_298._0_8_ != (ClientContext *)0x0) {
        (**(code **)(*(long *)local_298._0_8_ + 8))();
      }
      FunctionBinder::FunctionBinder((FunctionBinder *)local_3f8,local_5a0);
      FirstFunctionGetter::GetFunction((AggregateFunction *)local_298,other);
      local_4f8._0_8_ = local_558._M_allocated_capacity;
      local_4f8._8_8_ = local_558._8_8_;
      local_4f8._16_8_ = local_548.index;
      local_558._M_allocated_capacity = 0;
      local_558._8_8_ = 0;
      local_548.index = 0;
      local_4d0._M_p = (pointer)0x0;
      FunctionBinder::BindAggregateFunction
                ((FunctionBinder *)local_530,(AggregateFunction *)local_3f8,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_298,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_4f8,(AggregateType)&local_4d0);
      if ((__buckets_ptr)local_4d0._M_p != (__buckets_ptr)0x0) {
        (*(code *)(*(__node_base_ptr *)local_4d0._M_p)[1]._M_nxt)();
      }
      local_4d0._M_p = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_4f8);
      local_298._0_8_ = &PTR__AggregateFunction_01996688;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170);
      }
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_298);
      local_168._0_8_ = local_530;
      local_530 = (undefined1  [8])0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_598,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_168);
      if ((ClientContext *)local_168._0_8_ != (ClientContext *)0x0) {
        (*((BaseExpression *)local_168._0_8_)->_vptr_BaseExpression[1])();
      }
      if (bVar15 != false) {
        local_3d8._0_8_ = (pointer)0x0;
        local_3d8._8_8_ = (pointer)0x0;
        local_3c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        CountStarFun::GetFunction();
        local_438.table_index = local_3d8._0_8_;
        local_438.column_index = local_3d8._8_8_;
        local_428 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._0_8_;
        local_3d8._0_8_ = (ClientContext *)0x0;
        local_3d8._8_8_ = (pointer)0x0;
        local_3c8._0_8_ = (Binder *)0x0;
        local_500._M_head_impl = (LogicalProjection *)0x0;
        FunctionBinder::BindAggregateFunction
                  ((FunctionBinder *)local_4c8,(AggregateFunction *)local_3f8,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_168,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_438,0);
        if ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
            local_500._M_head_impl != (BoundCastData *)0x0) {
          (*((local_500._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
        }
        local_500._M_head_impl = (LogicalProjection *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_438);
        local_168._0_8_ = &PTR__AggregateFunction_01996688;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_b8[0xf] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_b8[0xf]);
        }
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_168);
        local_578 = (undefined1  [8])local_4c8._0_8_;
        local_4c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_598,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_578);
        if (local_578 != (undefined1  [8])0x0) {
          (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_578)->_M_allocated_capacity + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_4c8._0_8_ + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_3d8);
      }
      pBVar16 = local_5a0;
      aggregate_index =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)GenerateTableIndex(local_5a0);
      iVar34 = GenerateTableIndex(pBVar16);
      pLVar35 = (LogicalAggregate *)operator_new(0xe0);
      local_3d8[0] = local_598.id_;
      local_3d8[1] = local_598.physical_type_;
      local_3d8._2_6_ = local_598._2_6_;
      local_3d8._8_8_ =
           local_598.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_3c8._0_8_ =
           local_598.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_598._0_8_ = (ClientContext *)0x0;
      local_598.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_598.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      LogicalAggregate::LogicalAggregate
                (pLVar35,iVar34,(idx_t)aggregate_index,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_3d8);
      local_508._M_head_impl = pLVar35;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_3d8);
      pLVar36 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                              *)&local_508);
      local_4f8._32_8_ = local_5b8._M_head_impl;
      local_5b8._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                (&pLVar36->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_4f8 + 0x20));
      if ((element_type *)local_4f8._32_8_ != (element_type *)0x0) {
        (**(code **)(*(long *)local_4f8._32_8_ + 8))();
      }
      _Var13._M_head_impl = local_508._M_head_impl;
      _Var4._M_head_impl = local_5b8._M_head_impl;
      local_4f8._32_8_ = 0;
      local_508._M_head_impl = (LogicalAggregate *)0x0;
      local_5b8._M_head_impl = &(_Var13._M_head_impl)->super_LogicalOperator;
      if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
        (*(_Var4._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_480._M_head_impl = (LogicalLimit *)aggregate_index;
      if (bVar15 != false) {
        local_480._M_head_impl = (LogicalLimit *)GenerateTableIndex(local_5a0);
        pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                *)&local_5b8);
        pvVar24 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&pLVar18->expressions,0);
        pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar24);
        pBVar37 = (BoundColumnRefExpression *)operator_new(0x70);
        LogicalType::LogicalType((LogicalType *)local_3d8,&pEVar28->return_type);
        binding_02.column_index = 0;
        binding_02.table_index = (idx_t)aggregate_index;
        BoundColumnRefExpression::BoundColumnRefExpression
                  (pBVar37,(LogicalType *)local_3d8,binding_02,0);
        local_5a8._M_head_impl = (LogicalOperator *)pBVar37;
        LogicalType::~LogicalType((LogicalType *)local_3d8);
        pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                *)&local_5b8);
        pvVar24 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&pLVar18->expressions,1);
        pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar24);
        pBVar37 = (BoundColumnRefExpression *)operator_new(0x70);
        LogicalType::LogicalType((LogicalType *)local_3d8,&pEVar28->return_type);
        binding_03.column_index = 1;
        binding_03.table_index = (idx_t)aggregate_index;
        BoundColumnRefExpression::BoundColumnRefExpression
                  (pBVar37,(LogicalType *)local_3d8,binding_03,0);
        LogicalType::~LogicalType((LogicalType *)local_3d8);
        Value::BIGINT((Value *)local_4c8,1);
        pBVar16 = (Binder *)operator_new(0x98);
        Value::Value((Value *)local_3d8,(Value *)local_4c8);
        BoundConstantExpression::BoundConstantExpression
                  ((BoundConstantExpression *)pBVar16,(Value *)local_3d8);
        Value::~Value((Value *)local_3d8);
        Value::~Value((Value *)local_4c8);
        peVar29 = (element_type *)operator_new(0x68);
        local_4c8._0_8_ = pBVar16;
        local_3d8._0_8_ = pBVar37;
        BoundComparisonExpression::BoundComparisonExpression
                  ((BoundComparisonExpression *)peVar29,COMPARE_GREATERTHAN,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_3d8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_4c8);
        local_510._M_head_impl = (LogicalOperator *)peVar29;
        if ((Binder *)local_4c8._0_8_ != (Binder *)0x0) {
          (**(code **)(*(long *)local_4c8._0_8_ + 8))();
        }
        local_4c8._0_8_ = (Binder *)0x0;
        if ((BoundColumnRefExpression *)local_3d8._0_8_ != (BoundColumnRefExpression *)0x0) {
          (**(code **)(*(long *)local_3d8._0_8_ + 8))();
        }
        local_578 = (undefined1  [8])0x0;
        p_Stack_570 = (_Hash_node_base *)0x0;
        local_568._M_p = (pointer)0x0;
        Value::Value((Value *)local_4c8,
                     "More than one row returned by a subquery used as an expression - scalar subqueries can only return a single row.\n\nUse \"SET scalar_subquery_error_on_multiple_rows=false\" to revert to previous behavior of returning a random row."
                    );
        pLVar26 = (LogicalLimit *)operator_new(0x98);
        Value::Value((Value *)local_3d8,(Value *)local_4c8);
        BoundConstantExpression::BoundConstantExpression
                  ((BoundConstantExpression *)pLVar26,(Value *)local_3d8);
        Value::~Value((Value *)local_3d8);
        local_458._M_head_impl = pLVar26;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)local_578,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_458);
        if (local_458._M_head_impl != (LogicalLimit *)0x0) {
          (*((BaseExpression *)
            &((local_458._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator)->
            _vptr_BaseExpression[1])();
        }
        local_458._M_head_impl = (LogicalLimit *)0x0;
        Value::~Value((Value *)local_4c8);
        ErrorFun::GetFunction();
        local_458._M_head_impl = (LogicalLimit *)local_578;
        _Stack_450._M_nxt = p_Stack_570;
        local_448 = (aggregate_size_t)local_568._M_p;
        local_578 = (undefined1  [8])0x0;
        p_Stack_570 = (_Hash_node_base *)0x0;
        local_568._M_p = (pointer)0x0;
        FunctionBinder::BindScalarFunction
                  (&local_408,(ScalarFunction *)local_3f8,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_3d8,SUB81(&local_458,0),(optional_ptr<duckdb::Binder,_true>)0x0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_458);
        local_3d8._0_8_ = &PTR__ScalarFunction_01993078;
        if ((pointer)local_3c8._272_8_ != (pointer)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._272_8_);
        }
        if ((__node_base_ptr)local_3c8._176_8_ != (__node_base_ptr)0x0) {
          (*(code *)local_3c8._176_8_)(local_3c8 + 0xa0,local_3c8 + 0xa0,3);
        }
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3d8);
        pBVar30 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                                *)&local_5a8);
        pBVar31 = (pointer)unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                         *)&local_408);
        if (pBVar31 != pBVar30) {
          (pBVar31->super_Expression).return_type.id_ = (pBVar30->super_Expression).return_type.id_;
          (pBVar31->super_Expression).return_type.physical_type_ =
               (pBVar30->super_Expression).return_type.physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(pBVar31->super_Expression).return_type.type_info_,
                     &(pBVar30->super_Expression).return_type.type_info_);
        }
        make_uniq<duckdb::BoundCaseExpression,duckdb::unique_ptr<duckdb::BoundComparisonExpression,std::default_delete<duckdb::BoundComparisonExpression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                  ((duckdb *)&local_410,
                   (unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                    *)&local_510,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_408,
                   (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                    *)&local_5a8);
        local_4c8._0_8_ = local_410;
        local_478.binder.ptr = (Binder *)0x0;
        local_478.context = (ClientContext *)0x0;
        local_468 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_410 = (Binder *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_478,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_4c8);
        if ((Binder *)local_4c8._0_8_ != (Binder *)0x0) {
          (**(code **)(*(long *)local_4c8._0_8_ + 8))();
        }
        pLVar35 = (LogicalAggregate *)operator_new(0x70);
        local_4c8._0_8_ = local_478.binder.ptr;
        local_4c8._8_8_ = local_478.context;
        local_4b8[0]._M_allocated_capacity = local_468;
        local_478.binder.ptr = (Binder *)0x0;
        local_478.context = (ClientContext *)0x0;
        local_468 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        LogicalProjection::LogicalProjection
                  ((LogicalProjection *)pLVar35,(idx_t)local_480._M_head_impl,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_4c8);
        local_420._8_8_ = pLVar35;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_4c8);
        pLVar38 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                *)(local_420 + 8));
        local_408.context = (ClientContext *)local_5b8._M_head_impl;
        local_5b8._M_head_impl = (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  (&pLVar38->super_LogicalOperator,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_408.context);
        if (local_408.context != (ClientContext *)0x0) {
          (*((LogicalOperator *)
            &(local_408.context)->super_enable_shared_from_this<duckdb::ClientContext>)->
            _vptr_LogicalOperator[1])();
        }
        uVar41 = local_420._8_8_;
        _Var4._M_head_impl = local_5b8._M_head_impl;
        local_408.context = (ClientContext *)0x0;
        local_420._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_5b8._M_head_impl = (LogicalOperator *)uVar41;
        if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
          (*(_Var4._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_420._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          (*(*(_func_int ***)local_420._8_8_)[1])();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_478);
        if (local_410 != (Binder *)0x0) {
          (*(code *)(((local_410->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                      internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        if (local_408.binder.ptr != (Binder *)0x0) {
          (*(code *)((((local_408.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                      __weak_this_.internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)local_578);
        if ((element_type *)local_510._M_head_impl != (element_type *)0x0) {
          (*(((Expression *)&(local_510._M_head_impl)->_vptr_LogicalOperator)->super_BaseExpression)
            ._vptr_BaseExpression[1])();
        }
        if ((BoundColumnRefExpression *)local_5a8._M_head_impl != (BoundColumnRefExpression *)0x0) {
          (*(((Expression *)&(local_5a8._M_head_impl)->_vptr_LogicalOperator)->super_BaseExpression)
            ._vptr_BaseExpression[1])();
        }
      }
      peVar12 = local_538;
      local_478.binder.ptr =
           *(Binder **)
            &(((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *
               )&local_538->_vptr_ExtraTypeInfo)->_M_t).
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
      (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
       &local_538->_vptr_ExtraTypeInfo)->_M_t).
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
      local_5a8._M_head_impl = local_5b8._M_head_impl;
      local_5b8._M_head_impl = (LogicalOperator *)0x0;
      LogicalCrossProduct::Create
                ((LogicalCrossProduct *)local_4c8,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_478,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_5a8);
      uVar41 = local_4c8._0_8_;
      local_4c8._0_8_ = (Binder *)0x0;
      _Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
            &peVar12->_vptr_ExtraTypeInfo)->_M_t).
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
      (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
       &peVar12->_vptr_ExtraTypeInfo)->_M_t).
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar41;
      if (_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
          (LogicalOperator *)0x0) {
        (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                              _M_head_impl + 8))();
      }
      if ((Binder *)local_4c8._0_8_ != (Binder *)0x0) {
        (**(code **)(*(long *)local_4c8._0_8_ + 8))();
      }
      local_4c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if ((LogicalAggregate *)local_5a8._M_head_impl != (LogicalAggregate *)0x0) {
        (*((LogicalOperator *)&(local_5a8._M_head_impl)->_vptr_LogicalOperator)->
          _vptr_LogicalOperator[1])();
      }
      local_5a8._M_head_impl = (LogicalOperator *)0x0;
      if (local_478.binder.ptr != (Binder *)0x0) {
        (*(*(_func_int ***)
            &((local_478.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
             internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>)[1])();
      }
      local_478.binder.ptr = (Binder *)0x0;
      (*(code *)(((local_5b0->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_4c8);
      local_578 = (undefined1  [8])local_480._M_head_impl;
      p_Stack_570 = (_Hash_node_base *)0x0;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&local_510,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8,
                 other,(ColumnBinding *)local_578);
      uVar41 = local_510._M_head_impl;
      local_510._M_head_impl = (LogicalOperator *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._0_8_ != local_4b8) {
        operator_delete((void *)local_4c8._0_8_);
      }
      if (local_508._M_head_impl != (LogicalAggregate *)0x0) {
        (*((local_508._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      if (local_530 != (undefined1  [8])0x0) {
        (*((BaseExpression *)local_530)->_vptr_BaseExpression[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_558._M_local_buf);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_598);
      _Var23.super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>)
           (_Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>)local_528._0_8_;
LAB_00ca7b8e:
      if (_Var23.super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl !=
          (LogicalComparisonJoin *)0x0) {
        operator_delete((void *)_Var23.super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>
                                ._M_head_impl);
      }
    }
    else {
      if (cVar2 != '\x02') {
        pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                *)&local_5b8);
        (*pLVar18->_vptr_LogicalOperator[2])(local_168,pLVar18);
        pCVar32 = (ClientContext *)GenerateTableIndex(local_5a0);
        pBVar16 = (Binder *)operator_new(0x118);
        LogicalComparisonJoin::LogicalComparisonJoin
                  ((LogicalComparisonJoin *)pBVar16,MARK,LOGICAL_COMPARISON_JOIN);
        local_4c8._0_8_ = pBVar16;
        pLVar20 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)local_4c8);
        (pLVar20->super_LogicalJoin).mark_index = (idx_t)pCVar32;
        pLVar20 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)local_4c8);
        local_528._0_8_ =
             (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *
               )&local_538->_vptr_ExtraTypeInfo)->_M_t).
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
        (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
         &local_538->_vptr_ExtraTypeInfo)->_M_t).
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
             (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar20,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_528);
        if ((LogicalOperator *)local_528._0_8_ != (LogicalOperator *)0x0) {
          (**(code **)(*(long *)local_528._0_8_ + 8))();
        }
        local_528._0_8_ =
             (__uniq_ptr_data<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true,_true>
              )0x0;
        pLVar20 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)local_4c8);
        local_598._0_8_ = local_5b8._M_head_impl;
        local_5b8._M_head_impl = (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar20,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_598);
        local_3f8._16_8_ = pCVar32;
        if ((element_type *)local_598._0_8_ != (element_type *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_598._0_8_)->__weak_this_).
                      internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        local_598._0_8_ = (ClientContext *)0x0;
        if (local_5b0[0x10].
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
            local_5b0[0xf].
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) {
          local_480._M_head_impl = (LogicalLimit *)(local_5b0 + 0xf);
          local_3f8._24_8_ = local_5b0 + 0x13;
          pvVar1 = (vector<duckdb::LogicalType,_true> *)(local_5b0 + 0x16);
          sVar45 = 0;
          do {
            local_3d8._0_8_ = (pointer)0x0;
            local_3d8._8_8_ = (pointer)0x0;
            pvVar24 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                    *)local_480._M_head_impl,sVar45);
            _Var6._M_head_impl =
                 (pvVar24->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pvVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
              _Var8._M_nxt = *(_Hash_node_base **)local_3d8._0_8_;
              local_3d8._0_8_ = _Var6._M_head_impl;
              (*(code *)_Var8._M_nxt[1]._M_nxt)();
              _Var6._M_head_impl = (Expression *)local_3d8._0_8_;
            }
            local_3d8._0_8_ = _Var6._M_head_impl;
            pvVar25 = vector<duckdb::LogicalType,_true>::operator[]
                                ((vector<duckdb::LogicalType,_true> *)local_3f8._24_8_,sVar45);
            pvVar21 = vector<duckdb::ColumnBinding,_true>::operator[]
                                ((vector<duckdb::ColumnBinding,_true> *)local_168,sVar45);
            pBVar16 = (Binder *)operator_new(0x70);
            LogicalType::LogicalType((LogicalType *)local_298,pvVar25);
            binding_00.table_index = pvVar21->table_index;
            binding_00.column_index = pvVar21->column_index;
            BoundColumnRefExpression::BoundColumnRefExpression
                      ((BoundColumnRefExpression *)pBVar16,(LogicalType *)local_298,binding_00,0);
            LogicalType::~LogicalType((LogicalType *)local_298);
            local_4f8._0_8_ = pBVar16;
            pvVar25 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,sVar45);
            BoundCastExpression::AddDefaultCastToType
                      ((BoundCastExpression *)&local_558,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_4f8,pvVar25,false);
            uVar41 = local_3d8._8_8_;
            local_3d8._8_8_ = local_558._M_allocated_capacity;
            local_558._M_allocated_capacity = 0;
            if ((pointer)uVar41 != (pointer)0x0) {
              (*(code *)(*(__node_base_ptr *)uVar41)[1]._M_nxt)();
            }
            if ((long *)local_558._M_allocated_capacity != (long *)0x0) {
              (**(code **)(*(long *)local_558._M_allocated_capacity + 8))();
            }
            local_558._M_allocated_capacity = 0;
            if ((Binder *)local_4f8._0_8_ != (Binder *)0x0) {
              (*(((Expression *)local_4f8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_4f8._0_8_ = (Binder *)0x0;
            local_3c8[0] = *(undefined1 *)
                            &local_5b0[0x12].
                             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            pLVar20 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                    *)local_4c8);
            ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
            emplace_back<duckdb::JoinCondition>
                      (&(pLVar20->conditions).
                        super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                       (JoinCondition *)local_3d8);
            if ((element_type *)local_3d8._8_8_ != (element_type *)0x0) {
              (**(code **)(*(long *)local_3d8._8_8_ + 8))();
            }
            local_3d8._8_8_ = (pointer)0x0;
            if ((ClientContext *)local_3d8._0_8_ != (ClientContext *)0x0) {
              (**(code **)(*(long *)local_3d8._0_8_ + 8))();
            }
            sVar45 = sVar45 + 1;
          } while (sVar45 < (ulong)((long)local_5b0[0x10].
                                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                          _M_head_impl -
                                    (long)local_5b0[0xf].
                                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                          _M_head_impl >> 3));
        }
        uVar41 = local_4c8._0_8_;
        local_4c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        _Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *
               )&local_538->_vptr_ExtraTypeInfo)->_M_t).
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
        (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
         &local_538->_vptr_ExtraTypeInfo)->_M_t).
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
             (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar41;
        if (_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
            (LogicalOperator *)0x0) {
          (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                _M_head_impl + 8))();
        }
        puVar9 = local_5b0;
        (*(code *)(((local_5b0->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                  expressions).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_298,local_5b0);
        local_3d8._0_8_ = local_3f8._16_8_;
        local_3d8._8_8_ = (pointer)0x0;
        make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                  ((duckdb *)local_558._M_local_buf,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   (LogicalType *)(puVar9 + 7),(ColumnBinding *)local_3d8);
        uVar41 = local_558._M_allocated_capacity;
        local_558._M_allocated_capacity = 0;
        if ((ClientContext *)local_298._0_8_ != (ClientContext *)local_288) {
          operator_delete((void *)local_298._0_8_);
        }
        _Var23.super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>)
             (_Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>)local_168._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_4c8._0_8_ + 8))();
          _Var23.super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl =
               (_Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>)
               (_Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>)local_168._0_8_;
        }
        goto LAB_00ca7b8e;
      }
      BoundLimitNode::ConstantValue((BoundLimitNode *)local_3d8,1);
      BoundLimitNode::BoundLimitNode((BoundLimitNode *)local_4c8);
      this_01._M_t.
      super___uniq_ptr_impl<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalLimit_*,_std::default_delete<duckdb::LogicalLimit>_>.
      super__Head_base<0UL,_duckdb::LogicalLimit_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true,_true>
            )operator_new(0xa8);
      local_298._0_8_ = local_3d8._0_8_;
      local_298._8_8_ = local_3d8._8_8_;
      local_288._0_8_ = local_3c8._0_8_;
      local_288._8_8_ = local_3c8._8_8_;
      local_3c8._8_8_ = (_Hash_node_base *)0x0;
      local_168._0_8_ = local_4c8._0_8_;
      local_168._8_8_ = local_4c8._8_8_;
      local_158._0_8_ = local_4b8[0]._M_allocated_capacity;
      local_158._8_8_ = local_4b8[0]._8_8_;
      local_4b8[0]._8_8_ =
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      LogicalLimit::LogicalLimit
                ((LogicalLimit *)
                 this_01._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalLimit_*,_std::default_delete<duckdb::LogicalLimit>_>
                 .super__Head_base<0UL,_duckdb::LogicalLimit_*,_false>._M_head_impl,
                 (BoundLimitNode *)local_298,(BoundLimitNode *)local_168);
      local_578 = (undefined1  [8])
                  this_01._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalLimit_*,_std::default_delete<duckdb::LogicalLimit>_>
                  .super__Head_base<0UL,_duckdb::LogicalLimit_*,_false>._M_head_impl;
      if ((long *)local_158._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_158._8_8_ + 8))();
      }
      pBVar16 = local_5a0;
      local_158._8_8_ = 0;
      if ((_Hash_node_base *)local_288._8_8_ != (_Hash_node_base *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_288._8_8_)[1]._M_nxt)();
      }
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_4b8[0]._8_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_4b8[0]._8_8_ + 8))();
      }
      if ((_Hash_node_base *)local_3c8._8_8_ != (_Hash_node_base *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_3c8._8_8_)[1]._M_nxt)();
      }
      this_02 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>::
                operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                            *)local_578);
      local_458._M_head_impl = (LogicalLimit *)local_5b8._M_head_impl;
      local_5b8._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                (&this_02->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_458);
      if ((element_type *)local_458._M_head_impl != (element_type *)0x0) {
        (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                     &((local_458._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator)->
                    internal).super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      auVar11 = local_578;
      _Var4._M_head_impl = local_5b8._M_head_impl;
      local_458._M_head_impl = (LogicalLimit *)0x0;
      local_578 = (undefined1  [8])0x0;
      local_5b8._M_head_impl = (LogicalOperator *)auVar11;
      if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
        (*(_Var4._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      CountStarFun::GetFunction();
      FunctionBinder::FunctionBinder((FunctionBinder *)local_4f8,pBVar16);
      SimpleFunction::SimpleFunction((SimpleFunction *)local_168,(SimpleFunction *)local_298);
      local_168._0_8_ = &PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType((LogicalType *)(local_158 + 0x80),(LogicalType *)(local_238 + 0x30));
      local_158._152_4_ = local_200._16_4_;
      local_168._0_8_ = &PTR__AggregateFunction_01996688;
      puVar42 = auStack_1e8;
      puVar43 = auStack_b8;
      for (lVar39 = 0xd; lVar39 != 0; lVar39 = lVar39 + -1) {
        *puVar43 = *puVar42;
        puVar42 = puVar42 + (ulong)bVar46 * -2 + 1;
        puVar43 = puVar43 + (ulong)bVar46 * -2 + 1;
      }
      auStack_b8[0xd]._0_1_ =
           local_1c0[2].
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_1_;
      auStack_b8[0xd]._1_1_ =
           local_1c0[2].
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._1_1_;
      auStack_b8[0xe] = local_178;
      auStack_b8[0xf] = local_170;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((__pthread_internal_list *)local_170)->__next =
               *(int *)&((__pthread_internal_list *)local_170)->__next + 1;
          UNLOCK();
        }
        else {
          *(int *)&((__pthread_internal_list *)local_170)->__next =
               *(int *)&((__pthread_internal_list *)local_170)->__next + 1;
        }
      }
      local_528._0_8_ =
           (__uniq_ptr_data<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true,_true>
            )0x0;
      local_528._8_8_ =
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      local_528._16_8_ = (pointer)0x0;
      local_3f8._0_8_ = (_Hash_node_base *)0x0;
      FunctionBinder::BindAggregateFunction
                (&local_478,(AggregateFunction *)local_4f8,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_168,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_528,(AggregateType)local_3f8);
      if ((_Hash_node_base *)local_3f8._0_8_ != (_Hash_node_base *)0x0) {
        (*(code *)(*(_Hash_node_base **)local_3f8._0_8_)[1]._M_nxt)();
      }
      local_3f8._0_8_ = (_Hash_node_base *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_528);
      local_168._0_8_ = &PTR__AggregateFunction_01996688;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_b8[0xf] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_b8[0xf]);
      }
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_168);
      pBVar33 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                              *)&local_478);
      LogicalType::LogicalType(&local_598,&(pBVar33->super_Expression).return_type);
      local_3d8._0_8_ = local_478.binder.ptr;
      local_558._M_allocated_capacity = 0;
      local_558._8_8_ = (__buckets_ptr)0x0;
      local_548.index = 0;
      local_478.binder.ptr = (Binder *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_558._M_local_buf,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_3d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_3d8._0_8_ + 8))();
      }
      iVar34 = GenerateTableIndex(pBVar16);
      group_index = GenerateTableIndex(pBVar16);
      pLVar35 = (LogicalAggregate *)operator_new(0xe0);
      local_3d8._0_8_ = local_558._M_allocated_capacity;
      local_3d8._8_8_ = local_558._8_8_;
      local_3c8._0_8_ = local_548.index;
      local_558._M_allocated_capacity = 0;
      local_558._8_8_ = 0;
      local_548.index = 0;
      LogicalAggregate::LogicalAggregate
                (pLVar35,group_index,iVar34,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_3d8);
      local_530 = (undefined1  [8])pLVar35;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_3d8);
      pLVar36 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                              *)local_530);
      local_4d0._M_p = (pointer)local_5b8._M_head_impl;
      local_5b8._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                (&pLVar36->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_4d0);
      if ((LogicalLimit *)local_4d0._M_p != (LogicalLimit *)0x0) {
        (**(code **)(*(long *)local_4d0._M_p + 8))();
      }
      auVar11 = local_530;
      _Var4._M_head_impl = local_5b8._M_head_impl;
      local_4d0._M_p = (pointer)0x0;
      local_530 = (undefined1  [8])0x0;
      local_5b8._M_head_impl = (LogicalOperator *)auVar11;
      if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
        (*(_Var4._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      pBVar37 = (BoundColumnRefExpression *)operator_new(0x70);
      LogicalType::LogicalType((LogicalType *)local_3d8,&local_598);
      binding_04.column_index = 0;
      binding_04.table_index = iVar34;
      BoundColumnRefExpression::BoundColumnRefExpression
                (pBVar37,(LogicalType *)local_3d8,binding_04,0);
      LogicalType::~LogicalType((LogicalType *)local_3d8);
      Value::Numeric((Value *)local_4c8,&local_598,1);
      pBVar16 = (Binder *)operator_new(0x98);
      Value::Value((Value *)local_3d8,(Value *)local_4c8);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)pBVar16,(Value *)local_3d8);
      Value::~Value((Value *)local_3d8);
      Value::~Value((Value *)local_4c8);
      this_03 = (BoundComparisonExpression *)operator_new(0x68);
      local_4c8._0_8_ = pBVar16;
      local_3d8._0_8_ = pBVar37;
      BoundComparisonExpression::BoundComparisonExpression
                (this_03,COMPARE_BOUNDARY_START,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_3d8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_4c8);
      if ((Binder *)local_4c8._0_8_ != (Binder *)0x0) {
        (**(code **)(*(long *)local_4c8._0_8_ + 8))();
      }
      local_4c8._0_8_ = (Binder *)0x0;
      if ((BoundColumnRefExpression *)local_3d8._0_8_ != (BoundColumnRefExpression *)0x0) {
        (**(code **)(*(long *)local_3d8._0_8_ + 8))();
      }
      local_4c8._0_8_ = (Binder *)0x0;
      local_4c8._8_8_ = (pointer)0x0;
      local_4b8[0]._M_allocated_capacity = (Binder *)0x0;
      local_3d8._0_8_ = this_03;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_4c8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_3d8);
      if ((BoundComparisonExpression *)local_3d8._0_8_ != (BoundComparisonExpression *)0x0) {
        (**(code **)(*(long *)local_3d8._0_8_ + 8))();
      }
      table_index = (pointer)GenerateTableIndex(local_5a0);
      this_04._M_t.
      super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
      super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
            )operator_new(0x70);
      local_3d8._0_8_ = local_4c8._0_8_;
      local_3d8._8_8_ = local_4c8._8_8_;
      local_3c8._0_8_ = local_4b8[0]._M_allocated_capacity;
      local_4c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_4c8._8_8_ = (pointer)0x0;
      local_4b8[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      LogicalProjection::LogicalProjection
                ((LogicalProjection *)
                 this_04._M_t.
                 super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
                 .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl,
                 (idx_t)table_index,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_3d8);
      local_500._M_head_impl =
           (LogicalProjection *)
           this_04._M_t.
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_3d8);
      pLVar38 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                              *)&local_500);
      local_508._M_head_impl = (LogicalAggregate *)local_5b8._M_head_impl;
      local_5b8._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                (&pLVar38->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_508);
      if (local_508._M_head_impl != (LogicalAggregate *)0x0) {
        (*((local_508._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      _Var14._M_head_impl = local_500._M_head_impl;
      _Var4._M_head_impl = local_5b8._M_head_impl;
      local_508._M_head_impl = (LogicalAggregate *)0x0;
      local_500._M_head_impl = (LogicalProjection *)0x0;
      local_5b8._M_head_impl = &(_Var14._M_head_impl)->super_LogicalOperator;
      if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
        (*(_Var4._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      peVar12 = local_538;
      local_4f8._32_8_ =
           (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
            &local_538->_vptr_ExtraTypeInfo)->_M_t).
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
      (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
       &local_538->_vptr_ExtraTypeInfo)->_M_t).
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
      local_5a8._M_head_impl = local_5b8._M_head_impl;
      local_5b8._M_head_impl = (LogicalOperator *)0x0;
      LogicalCrossProduct::Create
                ((LogicalCrossProduct *)local_3d8,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_4f8 + 0x20),
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_5a8);
      uVar41 = local_3d8._0_8_;
      local_3d8._0_8_ = (pointer)0x0;
      _Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
            &peVar12->_vptr_ExtraTypeInfo)->_M_t).
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
      (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
       &peVar12->_vptr_ExtraTypeInfo)->_M_t).
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar41;
      if (_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
          (LogicalOperator *)0x0) {
        (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                              _M_head_impl + 8))();
      }
      if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
        (*(code *)(*(_Hash_node_base **)local_3d8._0_8_)[1]._M_nxt)();
      }
      local_3d8._0_8_ = (ClientContext *)0x0;
      if ((LogicalProjection *)local_5a8._M_head_impl != (LogicalProjection *)0x0) {
        (*((LogicalOperator *)&(local_5a8._M_head_impl)->_vptr_LogicalOperator)->
          _vptr_LogicalOperator[1])();
      }
      local_5a8._M_head_impl = (LogicalOperator *)0x0;
      if ((LogicalOperator *)local_4f8._32_8_ != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_4f8._32_8_ + 8))();
      }
      local_4f8._32_8_ = 0;
      (*(code *)(((local_5b0->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_3d8);
      local_438.column_index = 0;
      local_438.table_index = (idx_t)table_index;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalTypeId_const&,duckdb::ColumnBinding>
                ((duckdb *)&local_510,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                 &LogicalType::BOOLEAN,&local_438);
      uVar41 = local_510._M_head_impl;
      local_510._M_head_impl = (LogicalOperator *)0x0;
      if ((ClientContext *)local_3d8._0_8_ != (ClientContext *)local_3c8) {
        operator_delete((void *)local_3d8._0_8_);
      }
      if (local_500._M_head_impl != (LogicalProjection *)0x0) {
        (*((local_500._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_4c8);
      if (local_530 != (undefined1  [8])0x0) {
        (*((BaseExpression *)local_530)->_vptr_BaseExpression[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_558._M_local_buf);
      LogicalType::~LogicalType(&local_598);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478.binder.ptr !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&(local_478.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>)->
                     _M_allocated_capacity + 8))();
      }
      local_298._0_8_ = &PTR__AggregateFunction_01996688;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170);
      }
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_298);
      if (local_578 != (undefined1  [8])0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_578)->_M_allocated_capacity + 8))();
      }
    }
    peVar29 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar41;
    if (peVar29 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar29->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    if (local_5b8._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_5b8._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_5b8._M_head_impl = (LogicalOperator *)0x0;
    goto LAB_00ca8182;
  }
  local_580._M_head_impl = (LogicalOperator *)uVar41;
  pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  correlated_columns = &pBVar16->correlated_columns;
  bVar15 = true;
  if (*(char *)&local_5b0[0xe].
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl != '\x04') {
    bVar15 = PerformDuplicateElimination(local_5a0,correlated_columns);
  }
  cVar2 = *(char *)&local_5b0[0xe].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (cVar2 == '\x02') {
    uVar22._M_t.
    super___uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
    .super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true,_true>
          )GenerateTableIndex(local_5a0);
    local_558._M_allocated_capacity =
         (size_type)
         (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
          &local_538->_vptr_ExtraTypeInfo)->_M_t).
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
     &local_538->_vptr_ExtraTypeInfo)->_M_t).
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
    CreateDuplicateEliminatedJoin
              ((duckdb *)&local_598,correlated_columns,MARK,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_558._M_allocated_capacity,bVar15);
    if ((LogicalOperator *)local_558._M_allocated_capacity != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_558._M_allocated_capacity + 8))();
    }
    local_558._M_allocated_capacity = 0;
    pLVar20 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
              ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                            *)&local_598);
    (pLVar20->super_LogicalJoin).mark_index =
         (idx_t)uVar22._M_t.
                super___uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
                .super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl;
    FlattenDependentJoins::FlattenDependentJoins
              ((FlattenDependentJoins *)local_298,local_5a0,correlated_columns,bVar15,true);
    pLVar17 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)&local_580);
    FlattenDependentJoins::DetectCorrelatedExpressions
              ((FlattenDependentJoins *)local_298,pLVar17,false,0);
    local_438.table_index = (idx_t)local_580._M_head_impl;
    local_580._M_head_impl = (LogicalOperator *)0x0;
    FlattenDependentJoins::PushDownDependentJoin
              ((FlattenDependentJoins *)local_4f8,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_298,SUB81(&local_438,0));
    if ((element_type *)local_438.table_index != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_438.table_index)->__weak_this_)
                  .internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_438.table_index = 0;
    pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_4f8);
    (*pLVar18->_vptr_LogicalOperator[2])(local_3d8,pLVar18);
    pLVar19 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
              ::operator*((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                           *)&local_598);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
              ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_4c8,
               (vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_3d8);
    CreateDelimJoinConditions
              (pLVar19,correlated_columns,(vector<duckdb::ColumnBinding,_true> *)local_4c8,
               local_288._8_8_,bVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_4c8._0_8_);
    }
    pLVar20 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
              ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                            *)&local_598);
    local_578 = (undefined1  [8])local_4f8._0_8_;
    local_4f8._0_8_ = (Binder *)0x0;
    LogicalOperator::AddChild
              ((LogicalOperator *)pLVar20,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_578);
    if ((_Tuple_impl<0UL,_duckdb::LogicalLimit_*,_std::default_delete<duckdb::LogicalLimit>_>)
        local_578 != (LogicalLimit *)0x0) {
      (**(code **)(*(long *)local_578 + 8))();
    }
    uVar41 = local_598._0_8_;
    local_578 = (undefined1  [8])0x0;
    local_598._0_8_ = (ClientContext *)0x0;
    _Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
          &local_538->_vptr_ExtraTypeInfo)->_M_t).
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
     &local_538->_vptr_ExtraTypeInfo)->_M_t).
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar41;
    if (_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
    }
    puVar9 = local_5b0;
    (*(code *)(((local_5b0->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->expressions)
              .
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_168,local_5b0);
    local_528._8_8_ =
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    local_528._0_8_ =
         uVar22._M_t.
         super___uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
         .super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
              ((duckdb *)&local_458,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
               (LogicalType *)(puVar9 + 7),(ColumnBinding *)local_528);
    _Var40._M_head_impl = local_458._M_head_impl;
    local_458._M_head_impl = (LogicalLimit *)0x0;
LAB_00ca6c9e:
    if ((ClientContext *)local_168._0_8_ != (ClientContext *)local_158) {
      operator_delete((void *)local_168._0_8_);
    }
    if ((ClientContext *)local_3d8._0_8_ != (ClientContext *)0x0) {
      operator_delete((void *)local_3d8._0_8_);
    }
    if ((Binder *)local_4f8._0_8_ != (Binder *)0x0) {
      (*((LogicalOperator *)local_4f8._0_8_)->_vptr_LogicalOperator[1])();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_1c0);
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_200);
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_238);
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_288 + 0x18));
    _Var44._M_head_impl = (LogicalComparisonJoin *)local_598._0_8_;
  }
  else {
    if (cVar2 != '\x01') {
      _Var23.super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>)GenerateTableIndex(local_5a0);
      local_558._M_allocated_capacity =
           (size_type)
           (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
            &local_538->_vptr_ExtraTypeInfo)->_M_t).
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
      (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
       &local_538->_vptr_ExtraTypeInfo)->_M_t).
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
      CreateDuplicateEliminatedJoin
                ((duckdb *)&local_598,correlated_columns,MARK,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_558._M_allocated_capacity,bVar15);
      if ((LogicalOperator *)local_558._M_allocated_capacity != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_558._M_allocated_capacity + 8))();
      }
      local_558._M_allocated_capacity = 0;
      pLVar20 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_598);
      (pLVar20->super_LogicalJoin).mark_index =
           (idx_t)_Var23.super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl;
      FlattenDependentJoins::FlattenDependentJoins
                ((FlattenDependentJoins *)local_298,local_5a0,correlated_columns,true,true);
      pLVar17 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)&local_580);
      FlattenDependentJoins::DetectCorrelatedExpressions
                ((FlattenDependentJoins *)local_298,pLVar17,false,0);
      local_438.table_index = (idx_t)local_580._M_head_impl;
      local_580._M_head_impl = (LogicalOperator *)0x0;
      FlattenDependentJoins::PushDownDependentJoin
                ((FlattenDependentJoins *)local_4f8,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_298,SUB81(&local_438,0));
      if ((element_type *)local_438.table_index != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_438.table_index)->
                    __weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      local_438.table_index = 0;
      pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)local_4f8);
      (*pLVar18->_vptr_LogicalOperator[2])(local_3d8,pLVar18);
      pLVar19 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator*((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                             *)&local_598);
      ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
                ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_4c8,
                 (vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_3d8)
      ;
      CreateDelimJoinConditions
                (pLVar19,correlated_columns,(vector<duckdb::ColumnBinding,_true> *)local_4c8,
                 local_288._8_8_,bVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_4c8._0_8_);
      }
      _Var4._M_head_impl =
           local_5b0[0xf].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      _Var5._M_head_impl =
           local_5b0[0x10].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      local_3f8._16_8_ =
           _Var23.super__Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>._M_head_impl;
      if (8 < (ulong)((long)_Var5._M_head_impl - (long)_Var4._M_head_impl)) {
        this_05 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_168._0_8_ = local_158;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,
                   "Correlated IN/ANY/ALL with multiple columns not yet supported","");
        NotImplementedException::NotImplementedException(this_05,(string *)local_168);
        __cxa_throw(this_05,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      if (_Var5._M_head_impl != _Var4._M_head_impl) {
        local_480._M_head_impl = (LogicalLimit *)(local_5b0 + 0xf);
        local_3f8._24_8_ = local_5b0 + 0x13;
        pvVar1 = (vector<duckdb::LogicalType,_true> *)(local_5b0 + 0x16);
        sVar45 = 0;
        do {
          local_528._0_8_ = (_Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false>)0x0;
          local_528._8_8_ =
               (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                )0x0;
          pvVar24 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                  *)local_480._M_head_impl,sVar45);
          _Var6._M_head_impl =
               (pvVar24->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          if ((__uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
               )local_528._0_8_ !=
              (__uniq_ptr_impl<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>_>
               )0x0) {
            lVar39 = *(long *)local_528._0_8_;
            local_528._0_8_ = _Var6._M_head_impl;
            (**(code **)(lVar39 + 8))();
            _Var6._M_head_impl = (Expression *)local_528._0_8_;
          }
          local_528._0_8_ = _Var6._M_head_impl;
          pvVar25 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)local_3f8._24_8_,sVar45);
          pvVar21 = vector<duckdb::ColumnBinding,_true>::operator[]
                              ((vector<duckdb::ColumnBinding,_true> *)local_3d8,sVar45);
          pLVar26 = (LogicalLimit *)operator_new(0x70);
          LogicalType::LogicalType((LogicalType *)local_168,pvVar25);
          binding.table_index = pvVar21->table_index;
          binding.column_index = pvVar21->column_index;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)pLVar26,(LogicalType *)local_168,binding,0);
          LogicalType::~LogicalType((LogicalType *)local_168);
          local_458._M_head_impl = pLVar26;
          pvVar25 = vector<duckdb::LogicalType,_true>::operator[](pvVar1,sVar45);
          BoundCastExpression::AddDefaultCastToType
                    ((BoundCastExpression *)local_578,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_458,pvVar25,false);
          uVar41 = local_528._8_8_;
          local_528._8_8_ = local_578;
          local_578 = (undefined1  [8])0x0;
          if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
              uVar41 != (Expression *)0x0) {
            (**(code **)(*(long *)uVar41 + 8))();
          }
          if ((_Tuple_impl<0UL,_duckdb::LogicalLimit_*,_std::default_delete<duckdb::LogicalLimit>_>)
              local_578 != (LogicalLimit *)0x0) {
            (**(code **)(*(long *)local_578 + 8))();
          }
          local_578 = (undefined1  [8])0x0;
          if (local_458._M_head_impl != (LogicalLimit *)0x0) {
            (*((BaseExpression *)
              &((local_458._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator)->
              _vptr_BaseExpression[1])();
          }
          local_458._M_head_impl = (LogicalLimit *)0x0;
          local_528[0x10] =
               *(bool *)&local_5b0[0x12].
                         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          pLVar20 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                  *)&local_598);
          ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
          emplace_back<duckdb::JoinCondition>
                    (&(pLVar20->conditions).
                      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                     (JoinCondition *)local_528);
          if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
              local_528._8_8_ != (Expression *)0x0) {
            (**(code **)(*(size_type *)local_528._8_8_ + 8))();
          }
          local_528._8_8_ = (Expression *)0x0;
          if ((LogicalComparisonJoin *)local_528._0_8_ != (LogicalComparisonJoin *)0x0) {
            (**(code **)(*(long *)local_528._0_8_ + 8))();
          }
          sVar45 = sVar45 + 1;
        } while (sVar45 < (ulong)((long)local_5b0[0x10].
                                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                        _M_head_impl -
                                  (long)local_5b0[0xf].
                                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                        _M_head_impl >> 3));
      }
      pLVar20 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_598);
      uVar41 = local_3f8._16_8_;
      local_578 = (undefined1  [8])local_4f8._0_8_;
      local_4f8._0_8_ = (Binder *)0x0;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar20,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_578);
      if ((_Tuple_impl<0UL,_duckdb::LogicalLimit_*,_std::default_delete<duckdb::LogicalLimit>_>)
          local_578 != (LogicalLimit *)0x0) {
        (**(code **)(*(long *)local_578 + 8))();
      }
      uVar10 = local_598._0_8_;
      local_578 = (undefined1  [8])0x0;
      local_598._0_8_ = (ClientContext *)0x0;
      _Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
            &local_538->_vptr_ExtraTypeInfo)->_M_t).
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
      (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
       &local_538->_vptr_ExtraTypeInfo)->_M_t).
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar10;
      if (_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
          (LogicalOperator *)0x0) {
        (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                              _M_head_impl + 8))();
      }
      puVar9 = local_5b0;
      (*(code *)(((local_5b0->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_168,local_5b0);
      local_528._0_8_ = uVar41;
      local_528._8_8_ =
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&local_478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 (LogicalType *)(puVar9 + 7),(ColumnBinding *)local_528);
      _Var40._M_head_impl = (LogicalLimit *)local_478.binder.ptr;
      local_478.binder.ptr = (Binder *)0x0;
      goto LAB_00ca6c9e;
    }
    local_598._0_8_ =
         (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
          &local_538->_vptr_ExtraTypeInfo)->_M_t).
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
     &local_538->_vptr_ExtraTypeInfo)->_M_t).
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
    CreateDuplicateEliminatedJoin
              ((duckdb *)local_528,correlated_columns,SINGLE,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_598,bVar15);
    if ((LogicalOperator *)local_598._0_8_ != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_598._0_8_ + 8))();
    }
    local_598._0_8_ = (ClientContext *)0x0;
    FlattenDependentJoins::FlattenDependentJoins
              ((FlattenDependentJoins *)local_298,local_5a0,correlated_columns,bVar15,false);
    pLVar17 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)&local_580);
    FlattenDependentJoins::DetectCorrelatedExpressions
              ((FlattenDependentJoins *)local_298,pLVar17,false,0);
    local_4f8._0_8_ = local_580._M_head_impl;
    local_580._M_head_impl = (LogicalOperator *)0x0;
    FlattenDependentJoins::PushDownDependentJoin
              ((FlattenDependentJoins *)&local_558,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_298,SUB81(local_4f8,0));
    if ((element_type *)local_4f8._0_8_ != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_4f8._0_8_)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_4f8._0_8_ = (Binder *)0x0;
    pLVar18 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&local_558._M_allocated_capacity);
    (*pLVar18->_vptr_LogicalOperator[2])(local_3d8,pLVar18);
    pLVar19 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
              ::operator*((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                           *)local_528);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
              ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_4c8,
               (vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_3d8);
    CreateDelimJoinConditions
              (pLVar19,correlated_columns,(vector<duckdb::ColumnBinding,_true> *)local_4c8,
               local_288._8_8_,bVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_4c8._0_8_);
    }
    pLVar20 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
              ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                            *)local_528);
    local_438.table_index = local_558._M_allocated_capacity;
    local_558._M_allocated_capacity = 0;
    LogicalOperator::AddChild
              ((LogicalOperator *)pLVar20,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_438);
    if ((element_type *)local_438.table_index != (element_type *)0x0) {
      (*(((Expression *)local_438.table_index)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    uVar41 = local_528._0_8_;
    local_438.table_index = 0;
    local_528._0_8_ =
         (_Tuple_impl<0UL,_duckdb::LogicalComparisonJoin_*,_std::default_delete<duckdb::LogicalComparisonJoin>_>
          )0x0;
    _Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
          &local_538->_vptr_ExtraTypeInfo)->_M_t).
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
     &local_538->_vptr_ExtraTypeInfo)->_M_t).
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar41;
    if (_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
    }
    (*(code *)(((local_5b0->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->expressions)
              .
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_168);
    pvVar21 = vector<duckdb::ColumnBinding,_true>::operator[]
                        ((vector<duckdb::ColumnBinding,_true> *)local_3d8,local_288._16_8_);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&>
              ((duckdb *)local_578,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
               (LogicalType *)(local_5b0 + 7),pvVar21);
    _Var40._M_head_impl = (LogicalLimit *)local_578;
    local_578 = (undefined1  [8])0x0;
    if ((ClientContext *)local_168._0_8_ != (ClientContext *)local_158) {
      operator_delete((void *)local_168._0_8_);
    }
    if ((ClientContext *)local_3d8._0_8_ != (ClientContext *)0x0) {
      operator_delete((void *)local_3d8._0_8_);
    }
    if ((long *)local_558._M_allocated_capacity != (long *)0x0) {
      (**(code **)(*(long *)local_558._M_allocated_capacity + 8))();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_1c0);
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_200);
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_238);
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_288 + 0x18));
    _Var44._M_head_impl = (LogicalComparisonJoin *)local_528._0_8_;
  }
  if ((ClientContext *)_Var44._M_head_impl != (ClientContext *)0x0) {
    (*((_Var44._M_head_impl)->super_LogicalJoin).super_LogicalOperator._vptr_LogicalOperator[1])();
  }
  peVar29 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var40._M_head_impl;
  if (peVar29 != (element_type *)0x0) {
    (**(code **)(*(long *)&(peVar29->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8
                ))();
  }
  if (local_580._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_580._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_580._M_head_impl = (LogicalOperator *)0x0;
LAB_00ca8182:
  pBVar16 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2a8);
  if (pBVar16->has_unplanned_dependent_joins == true) {
    local_298._0_8_ = &PTR__RecursiveDependentJoinPlanner_019cb2a8;
    local_298._8_8_ = (pointer)0x0;
    local_288._0_8_ = local_5a0;
    pLVar17 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)local_538);
    RecursiveDependentJoinPlanner::VisitOperator((RecursiveDependentJoinPlanner *)local_298,pLVar17)
    ;
    local_298._0_8_ = &PTR__RecursiveDependentJoinPlanner_019cb2a8;
    if ((pointer)local_298._8_8_ != (pointer)0x0) {
      (*(code *)(*(__node_base_ptr *)local_298._8_8_)[1]._M_nxt)();
    }
  }
  if ((element_type *)local_420._0_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_420._0_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> Binder::PlanSubquery(BoundSubqueryExpression &expr, unique_ptr<LogicalOperator> &root) {
	D_ASSERT(root);
	// first we translate the QueryNode of the subquery into a logical plan
	// note that we do not plan nested subqueries yet
	auto sub_binder = Binder::CreateBinder(context, this);
	sub_binder->is_outside_flattened = false;
	auto subquery_root = sub_binder->CreatePlan(*expr.subquery);
	D_ASSERT(subquery_root);

	// now we actually flatten the subquery
	auto plan = std::move(subquery_root);

	unique_ptr<Expression> result_expression;
	if (!expr.IsCorrelated()) {
		result_expression = PlanUncorrelatedSubquery(*this, expr, root, std::move(plan));
	} else {
		result_expression = PlanCorrelatedSubquery(*this, expr, root, std::move(plan));
	}
	// finally, we recursively plan the nested subqueries (if there are any)
	if (sub_binder->has_unplanned_dependent_joins) {
		RecursiveDependentJoinPlanner plan(*this);
		plan.VisitOperator(*root);
	}
	return result_expression;
}